

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract_depthmap.cpp
# Opt level: O3

int parse_huawei_trailer
              (uchar *data,size_t size,uchar **cv,size_t *cv_size,uchar **dm,size_t *dm_size,
              size_t *dm_width,size_t *dm_height,image_type_t *dm_type,uint32_t *orientation)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uchar *puVar6;
  uint uVar7;
  uint *puVar8;
  uchar *puVar9;
  long lVar10;
  
  iVar4 = 0;
  if (((data <= data + (size - 8)) && (iVar4 = 0, *(long *)(data + (size - 8)) == 0x6e456874706544))
     && (puVar8 = (uint *)(data + (size - 0xc)), iVar4 = 0, data <= puVar8)) {
    uVar3 = *puVar8;
    puVar9 = (uchar *)((long)puVar8 - (ulong)uVar3);
    if (data <= puVar9) {
      puVar6 = data + (size - uVar3);
      lVar5 = 0;
      do {
        printf("%02X",(ulong)puVar9[lVar5]);
        if ((~(uint)lVar5 & 0xf) == 0) {
          fputs("  ",_stdout);
          lVar10 = -0x1b;
          do {
            uVar7 = (uint)puVar6[lVar10];
            iVar4 = isprint((uint)puVar6[lVar10]);
            if (iVar4 == 0) {
              uVar7 = 0x2e;
            }
            putchar(uVar7);
            lVar10 = lVar10 + 1;
          } while (lVar10 != -0xb);
          putchar(10);
        }
        else if ((~(uint)lVar5 & 3) == 0) {
          fputs("   ",_stdout);
        }
        else {
          putchar(0x20);
        }
        lVar5 = lVar5 + 1;
        puVar6 = puVar6 + 1;
      } while (lVar5 != 0x40);
      if ((byte)(puVar9[3] - 0x10) < 4) {
        *orientation = *(uint32_t *)(&DAT_003081b0 + (ulong)(byte)(puVar9[3] - 0x10) * 4);
      }
      uVar1 = *(ushort *)(puVar9 + 0xc);
      uVar2 = *(ushort *)(puVar9 + 0xe);
      uVar7 = (uint)uVar2 * (uint)uVar1;
      iVar4 = 0;
      if (((uVar7 <= uVar3) && (puVar8 = (uint *)(puVar9 + -0xc), data <= puVar8)) &&
         ((*(int *)(puVar9 + -8) == 0x666f6465 && (*(int *)(puVar9 + -4) == 0)))) {
        uVar3 = *puVar8;
        puVar6 = (uchar *)((long)puVar8 - (ulong)uVar3);
        if (data <= puVar6) {
          *cv = puVar6;
          *cv_size = (ulong)uVar3;
          *dm = puVar9 + 0x40;
          *dm_size = (ulong)uVar7;
          *dm_width = (ulong)uVar1;
          *dm_height = (ulong)uVar2;
          *dm_type = TYPE_RAW;
          iVar4 = 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int parse_huawei_trailer(const unsigned char *data, const size_t size,
                         const unsigned char **cv, size_t *cv_size,
                         const unsigned char **dm, size_t *dm_size,
                         size_t *dm_width, size_t *dm_height, image_type_t *dm_type,
                         uint32_t *orientation) {
    const size_t dm_header_size = 64;

    // check if file ends with "DepthEn\0"
    static const char HUAWEI_END_MARKER[] = {'D', 'e', 'p', 't', 'h', 'E', 'n', '\0'};

    const unsigned char *iter = data + size - sizeof(HUAWEI_END_MARKER);

    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    if (memcmp(iter, HUAWEI_END_MARKER, sizeof(HUAWEI_END_MARKER))) {
        // fprintf(stderr, "trailer doesn't end with \"DepthEn\\0\"\n");
        return 0;
    }

    // The 4 bytes before that are the relative jump to the start of the depth map structure
    iter -= 4;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }
    const uint32_t dm_block_size = read_ui32(iter);

    // go to the start of the data structure where the depth map is in
    iter -= dm_block_size;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }
    const unsigned char *dm_start = iter;
    const unsigned char *dm_data_start = dm_start + dm_header_size;

    print_hex(file_data, dm_start, dm_header_size);

    switch(dm_start[3]) {
        case 0x10: *orientation = 1; break;
        case 0x11: *orientation = 8; break;
        case 0x12: *orientation = 3; break;
        case 0x13: *orientation = 6; break;
        default: break;
    }

    const uint16_t width = read_ui16(dm_start + 12);
    const uint16_t height = read_ui16(dm_start + 14);

    if (width * height > dm_block_size) {
        // fprintf(stderr, "broken file\n");
        return 0;
    }

    // now we need the original color image
    iter = dm_start - 12;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    if (memcmp(iter + 4, "edof", 4) || read_ui32(iter + 8) != 0) {
        // fprintf(stderr, "unexpected file content\n");
        return 0;
    }

    const uint32_t jpeg_size = read_ui32(iter);

    iter -= jpeg_size;
    if (iter < data) {
        // fprintf(stderr, "filesize too small\n");
        return 0;
    }

    const unsigned char *jpeg_data_start = iter;

    *cv = jpeg_data_start;
    *cv_size = jpeg_size;
    *dm = dm_data_start;
    *dm_size = width * height;
    *dm_width = width;
    *dm_height = height;
    *dm_type = TYPE_RAW;

    return 1;
}